

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,void *ptr)

{
  long lVar1;
  uint uVar2;
  void *local_10;
  
  local_10 = ptr;
  uVar2 = ~(this->IDStack).Data[(long)(this->IDStack).Size + -1];
  lVar1 = 0;
  do {
    uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&local_10 + lVar1) ^ uVar2 & 0xff];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  uVar2 = ~uVar2;
  if (this->Ctx->DebugHookIdInfo == uVar2) {
    ImGui::DebugHookIdInfo(uVar2,0xd,ptr,(void *)0x0);
  }
  return uVar2;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&ptr, sizeof(void*), seed);
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    ImGuiContext& g = *Ctx;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_Pointer, ptr, NULL);
#endif
    return id;
}